

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  __time_t _Var2;
  int iVar3;
  ulong uVar4;
  char *__ptr;
  size_t sStack_70;
  nvamemtiming_conf conf;
  timeval tv;
  
  signal(2,signal_handler);
  signal(0xb,signal_handler);
  iVar3 = nva_init();
  if (iVar3 == 0) {
    parse_cmd_line(argc,argv,&conf);
    iVar3 = vbios_read(conf.vbios.file,&conf.vbios.data,&conf.vbios.length);
    if (iVar3 == 1) {
      iVar3 = read_timings(&conf);
      if (iVar3 != 0) {
        fwrite("read_timings failed!\n",0x15,1,_stderr);
        return -1;
      }
      iVar3 = 0;
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_sec;
      switch(conf.mode) {
      case MODE_AUTO:
        iVar3 = shallow_dump(&conf);
        break;
      case MODE_BITFIELD:
        iVar3 = bitfield_check(&conf);
        break;
      case MODE_MANUAL:
        iVar3 = manual_check(&conf);
        break;
      case MODE_DEEP:
        iVar3 = deep_dump(&conf);
      }
      gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
      uVar4 = tv.tv_sec - _Var2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      printf("The run tested %i configurations in %li:%li:%lis\n",(ulong)conf.counter,uVar4 / 0xe10,
             (ulong)(ushort)(SUB162(auVar1 % ZEXT816(0xe10),0) / 0x3c),uVar4 % 0x3c);
      return iVar3;
    }
    __ptr = "Error while reading the vbios\n";
    sStack_70 = 0x1e;
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_70 = 0x12;
  }
  fwrite(__ptr,sStack_70,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char** argv)
{
	unsigned long start_time, total_time;
	struct nvamemtiming_conf conf;
	struct timeval tv;
	int ret;

	signal(SIGINT, signal_handler);
	signal(SIGSEGV, signal_handler);

	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}

	parse_cmd_line(argc, argv, &conf);

	/* read the vbios */
	if (vbios_read(conf.vbios.file, &conf.vbios.data, &conf.vbios.length) != 1) {
		fprintf(stderr, "Error while reading the vbios\n");
		return 1;
	}

	/* parse the timing table */
	ret = read_timings(&conf);
	if (ret) {
		fprintf(stderr, "read_timings failed!\n");
		return ret;
	}

	/* start the counter to return how long did the run take */
	gettimeofday(&tv, NULL);
	start_time = tv.tv_sec;

	switch (conf.mode) {
	case MODE_AUTO:
		ret = shallow_dump(&conf);
		break;
	case MODE_DEEP:
		ret = deep_dump(&conf);
		break;
	case MODE_BITFIELD:
		ret = bitfield_check(&conf);
		break;
	case MODE_MANUAL:
		ret = manual_check(&conf);
		break;
	}

	gettimeofday(&tv, NULL);
	total_time = tv.tv_sec - start_time;

	printf("The run tested %i configurations in %li:%li:%lis\n",
	       conf.counter,
	       total_time / 3600,
	       (total_time % 3600) / 60,
	       total_time % 60);

	return ret;
}